

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestItem_PRIVATE * __thiscall
ON_ComponentManifestTableIndex::SystemItemFromIndex
          (ON_ComponentManifestTableIndex *this,int sytem_item_index)

{
  int iVar1;
  ON_ComponentManifestItem_PRIVATE *local_28;
  ON_ComponentManifestItem_PRIVATE *system_item;
  int sytem_item_index_local;
  ON_ComponentManifestTableIndex *this_local;
  
  if ((((this->m_bIndexedComponent & 1U) != 0) && (sytem_item_index < 0)) &&
     (-0x7fffffff < sytem_item_index)) {
    for (local_28 = this->m_first_system_item; local_28 != (ON_ComponentManifestItem_PRIVATE *)0x0;
        local_28 = local_28->m_next) {
      iVar1 = ON_ComponentManifestItem::Index(&local_28->super_ON_ComponentManifestItem);
      if (iVar1 == sytem_item_index) {
        return local_28;
      }
    }
  }
  return (ON_ComponentManifestItem_PRIVATE *)0x0;
}

Assistant:

const ON_ComponentManifestItem_PRIVATE* ON_ComponentManifestTableIndex::SystemItemFromIndex(
  int sytem_item_index
  ) const
{
  if (m_bIndexedComponent && sytem_item_index < 0 && sytem_item_index > ON_UNSET_INT_INDEX )
  {
    // The linked list of system items is always short - hash tables and sorting are a waste of time
    for (const ON_ComponentManifestItem_PRIVATE* system_item = m_first_system_item; nullptr != system_item; system_item = system_item->m_next)
    {
      if ( system_item->Index() == sytem_item_index )
        return system_item;
    }
  }

  return nullptr;
}